

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

void __thiscall glslang::TStringAtomMap::addAtomFixed(TStringAtomMap *this,char *s,int atom)

{
  size_type sVar1;
  pointer ppVar2;
  reference ppbVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>
  *__x;
  value_type local_80;
  __node_type *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>
  local_68;
  __node_type *local_38;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_false,_true>
  local_28;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_false,_true>
  it;
  char *pcStack_18;
  int atom_local;
  char *s_local;
  TStringAtomMap *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
  ._M_cur._4_4_ = atom;
  pcStack_18 = s;
  s_local = (char *)this;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>
  ::pair<const_char_*&,_int_&,_true>
            (&local_68,&stack0xffffffffffffffe8,
             (int *)((long)&it.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
                            ._M_cur + 4));
  local_78 = (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,int,std::hash<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::equal_to<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,int>>>
             ::
             insert<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,int>>
                       ((__enable_if_t<is_constructible<value_type,_pair<basic_string<char,_char_traits<char>,_pool_allocator<char>_>,_int>_&&>::value,_pair<iterator,_bool>_>
                         *)this,&local_68,__x);
  local_38 = local_78;
  local_28.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
               )local_78;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>
  ::~pair(&local_68);
  sVar1 = std::
          vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
          ::size(&(this->stringMap).
                  super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
                );
  if (sVar1 < (long)it.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
                    ._M_cur._4_4_ + 1U) {
    local_80 = &this->badToken;
    std::
    vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
    ::resize(&(this->stringMap).
              super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
             ,(long)(it.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
                     ._M_cur._4_4_ + 100),&local_80);
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_false,_true>
           ::operator->(&local_28);
  ppbVar3 = std::
            vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
            ::operator[](&(this->stringMap).
                          super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
                         ,(long)it.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_true>
                                ._M_cur._4_4_);
  *ppbVar3 = &ppVar2->first;
  return;
}

Assistant:

void addAtomFixed(const char* s, int atom)
    {
        auto it = atomMap.insert(std::pair<TString, int>(s, atom)).first;
        if (stringMap.size() < (size_t)atom + 1)
            stringMap.resize(atom + 100, &badToken);
        stringMap[atom] = &it->first;
    }